

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleStringTokenizer.cpp
# Opt level: O3

void __thiscall SimpleStringTokenizer::SkipTillToken(SimpleStringTokenizer *this)

{
  Byte *pBVar1;
  int iVar2;
  undefined4 extraout_var;
  ulong uVar3;
  Byte buffer;
  Byte local_19;
  
  local_19 = '\0';
  if (this->mStream != (IByteReader *)0x0) {
    do {
      iVar2 = (*this->mStream->_vptr_IByteReader[3])();
      if ((char)iVar2 == '\0') {
        return;
      }
      this->mStreamPositionTracker = this->mStreamPositionTracker + 1;
      if (this->mHasTokenBuffer == true) {
        local_19 = this->mTokenBuffer;
        this->mHasTokenBuffer = false;
      }
      else {
        iVar2 = (*this->mStream->_vptr_IByteReader[2])(this->mStream,&local_19,1);
        if (CONCAT44(extraout_var,iVar2) != 1) {
          return;
        }
      }
      uVar3 = 0;
      do {
        pBVar1 = "" + uVar3;
        if (4 < uVar3) break;
        uVar3 = uVar3 + 1;
      } while (*pBVar1 != local_19);
    } while (*pBVar1 == local_19);
    this->mHasTokenBuffer = true;
    this->mTokenBuffer = local_19;
    this->mStreamPositionTracker = this->mStreamPositionTracker + -1;
  }
  return;
}

Assistant:

void SimpleStringTokenizer::SkipTillToken()
{
	Byte buffer = 0;

	if(!mStream)
		return;

	// skip till hitting first non space, or segment end
	while(mStream->NotEnded())
	{
		if(GetNextByteForToken(buffer) != PDFHummus::eSuccess)
			break;

		if(!IsPDFWhiteSpace(buffer))
		{
			SaveTokenBuffer(buffer);
			break;
		}
	}
}